

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetInfoRequestRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pModelID,int *pHardwareVersion,int *pFirmwareMajor,
              int *pFirmwareMinor,char *SerialNumber)

{
  int iVar1;
  int local_74 [2];
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar databuf [20];
  uint8 local_46 [2];
  int local_44;
  uchar reqbuf [2];
  char *pcStack_40;
  int i;
  char *SerialNumber_local;
  int *pFirmwareMinor_local;
  int *pFirmwareMajor_local;
  int *pHardwareVersion_local;
  int *pModelID_local;
  RPLIDAR *pRPLIDAR_local;
  
  local_44 = 0;
  local_46[0] = 0xa5;
  local_46[1] = 'P';
  DataType = 0;
  local_74[1] = 0;
  local_74[0] = 0;
  pcStack_40 = SerialNumber;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,local_46,2);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataType,local_74 + 1,local_74);
    if (iVar1 == 0) {
      if ((DataType == 0x14) && (local_74[0] == 4)) {
        memset(&SendMode,0,0x14);
        iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)&SendMode,0x14);
        if (iVar1 == 0) {
          *pModelID = (uint)(byte)SendMode;
          *pFirmwareMinor = (uint)SendMode._1_1_;
          *pFirmwareMajor = (uint)SendMode._2_1_;
          *pHardwareVersion = (uint)SendMode._3_1_;
          memset(pcStack_40,0,0x21);
          for (local_44 = 0; local_44 < 0x10; local_44 = local_44 + 1) {
            sprintf(pcStack_40 + (local_44 << 1),"%02X",
                    (ulong)*(byte *)((long)&SendMode + (long)(local_44 + 4)));
          }
          pRPLIDAR_local._4_4_ = 0;
        }
        else {
          printf("A RPLIDAR is not responding correctly. \n");
          pRPLIDAR_local._4_4_ = 1;
        }
      }
      else {
        printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
        pRPLIDAR_local._4_4_ = 1;
      }
    }
    else {
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetInfoRequestRPLIDAR(RPLIDAR* pRPLIDAR, int* pModelID, int* pHardwareVersion, int* pFirmwareMajor, int* pFirmwareMinor, char* SerialNumber)
{
	int i = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
    sl_lidar_response_device_info_t devinfo;

	if (SL_IS_FAIL(pRPLIDAR->drv->getDeviceInfo(devinfo)))
	{
		printf("A RPLIDAR is not responding correctly : getDeviceInfo() failed. \n");
		return EXIT_FAILURE;
	}

	// Analyze the data response.
	*pModelID = devinfo.model;
	*pFirmwareMinor = (devinfo.firmware_version & 0x00FF);
	*pFirmwareMajor = (devinfo.firmware_version >> 8);
	*pHardwareVersion = devinfo.hardware_version;

	// 128bit unique serial number, when converting to text in hex, the Least Significant Byte prints first.
	memset(SerialNumber, 0, MAX_BUF_LEN_SERIAL_NUMBER_RPLIDAR);
	for (i = 0; i < NB_BYTES_SERIAL_NUMBER_RPLIDAR; i++)
	{
		sprintf(SerialNumber+2*i, "%02X", (int)(unsigned char)devinfo.serialnum[i]);
	}
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,GET_INFO_REQUEST_RPLIDAR};
	unsigned char databuf[20];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != 20)||(DataType != DEVINFO_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	{ 
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze the data response.
	*pModelID = databuf[0];
	*pFirmwareMinor = databuf[1];
	*pFirmwareMajor = databuf[2];
	*pHardwareVersion = databuf[3];

	// 128bit unique serial number, when converting to text in hex, the Least Significant Byte prints first.
	memset(SerialNumber, 0, MAX_BUF_LEN_SERIAL_NUMBER_RPLIDAR);
	for (i = 0; i < NB_BYTES_SERIAL_NUMBER_RPLIDAR; i++)
	{
		sprintf(SerialNumber+2*i, "%02X", (int)(unsigned char)databuf[i+4]);
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}